

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

ostream * cppnet::operator<<(ostream *out,Address *addr)

{
  long lVar1;
  undefined1 local_38 [8];
  string str;
  Address *addr_local;
  ostream *out_local;
  
  Address::AsString_abi_cxx11_((Address *)local_38);
  lVar1 = std::__cxx11::string::c_str();
  std::__cxx11::string::length();
  std::ostream::write((char *)out,lVar1);
  std::__cxx11::string::~string((string *)local_38);
  return out;
}

Assistant:

std::ostream& operator<< (std::ostream &out, Address &addr) {
    const std::string str = addr.AsString();
    out.write(str.c_str(), str.length());
    return out;
}